

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall ArgTest_WStringArg_Test::TestBody(ArgTest_WStringArg_Test *this)

{
  wchar_t *pwVar1;
  MockSpec<test_result_(const_wchar_t_*)> *this_00;
  StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *pSVar2;
  StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> visitor_3;
  StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> visitor_2;
  StrictMock<mock_visitor<const_wchar_t_*>_> visitor_1;
  StrictMock<mock_visitor<const_wchar_t_*>_> visitor;
  wstring_view sref;
  wchar_t *cstr;
  wchar_t *str;
  wchar_t str_data [5];
  basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_fffffffffffffac8;
  StrictMock<mock_visitor<const_wchar_t_*>_> *in_stack_fffffffffffffad0;
  StrictMock<mock_visitor<const_wchar_t_*>_> *in_stack_fffffffffffffaf0;
  wchar_t *in_stack_fffffffffffffb08;
  Matcher<const_wchar_t_*> *in_stack_fffffffffffffb10;
  Matcher<fmt::v5::basic_string_view<wchar_t>_> *in_stack_fffffffffffffb30;
  basic_string_view<wchar_t> in_stack_fffffffffffffb38;
  char *in_stack_fffffffffffffbc0;
  char *in_stack_fffffffffffffbc8;
  int in_stack_fffffffffffffbd4;
  char *in_stack_fffffffffffffbd8;
  MockSpec<test_result_(const_wchar_t_*)> *in_stack_fffffffffffffbe0;
  allocator local_3a9;
  wstring local_3a8 [64];
  undefined8 local_368;
  undefined8 uStack_360;
  wchar_t local_220 [118];
  undefined8 local_48;
  undefined8 uStack_40;
  wchar_t *local_38;
  wchar_t *local_30;
  wchar_t local_28 [10];
  
  builtin_wcsncpy(local_28,L"test",5);
  local_38 = local_28;
  local_30 = local_38;
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)in_stack_fffffffffffffad0,
             (wchar_t *)in_stack_fffffffffffffac8);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(in_stack_fffffffffffffaf0);
  testing::Matcher<const_wchar_t_*>::Matcher(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  this_00 = mock_visitor<const_wchar_t_*>::gmock_visit
                      ((mock_visitor<const_wchar_t_*> *)in_stack_fffffffffffffad0,
                       (Matcher<const_wchar_t_*> *)in_stack_fffffffffffffac8);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  testing::Matcher<const_wchar_t_*>::~Matcher((Matcher<const_wchar_t_*> *)0x12191b);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t*>
            ((wchar_t **)in_stack_fffffffffffffad0);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(in_stack_fffffffffffffad0);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::StrictMock(in_stack_fffffffffffffaf0);
  testing::Matcher<const_wchar_t_*>::Matcher((Matcher<const_wchar_t_*> *)this_00,local_220);
  mock_visitor<const_wchar_t_*>::gmock_visit
            ((mock_visitor<const_wchar_t_*> *)in_stack_fffffffffffffad0,
             (Matcher<const_wchar_t_*> *)in_stack_fffffffffffffac8);
  testing::internal::MockSpec<test_result_(const_wchar_t_*)>::InternalExpectedAt
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  testing::Matcher<const_wchar_t_*>::~Matcher((Matcher<const_wchar_t_*> *)0x1219d3);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,wchar_t_const*>
            ((wchar_t **)in_stack_fffffffffffffad0);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<wchar_t_const*>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  testing::StrictMock<mock_visitor<const_wchar_t_*>_>::~StrictMock(in_stack_fffffffffffffad0);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)
             in_stack_fffffffffffffaf0);
  local_368 = local_48;
  uStack_360 = uStack_40;
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
  pSVar2 = (StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)
           mock_visitor<fmt::v5::basic_string_view<wchar_t>_>::gmock_visit
                     ((mock_visitor<fmt::v5::basic_string_view<wchar_t>_> *)
                      in_stack_fffffffffffffad0,
                      (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)in_stack_fffffffffffffac8);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            ((MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::~Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)0x121aa3);
  pwVar1 = local_30;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring(local_3a8,pwVar1,&local_3a9);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,std::__cxx11::wstring>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
             in_stack_fffffffffffffad0);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)
             in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  std::__cxx11::wstring::~wstring(local_3a8);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_3a9);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock
            ((StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)
             in_stack_fffffffffffffad0);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::StrictMock(pSVar2);
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::Matcher
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb38);
  pSVar2 = (StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_> *)
           mock_visitor<fmt::v5::basic_string_view<wchar_t>_>::gmock_visit
                     ((mock_visitor<fmt::v5::basic_string_view<wchar_t>_> *)
                      in_stack_fffffffffffffad0,
                      (Matcher<fmt::v5::basic_string_view<wchar_t>_> *)in_stack_fffffffffffffac8);
  testing::internal::MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)>::InternalExpectedAt
            ((MockSpec<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)
             in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
             in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
  testing::Matcher<fmt::v5::basic_string_view<wchar_t>_>::~Matcher
            ((Matcher<fmt::v5::basic_string_view<wchar_t>_> *)0x121bc5);
  fmt::v5::basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)pSVar2,(wchar_t *)in_stack_fffffffffffffac8);
  (anonymous_namespace)::
  make_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>,fmt::v5::basic_string_view<wchar_t>>
            ((basic_string_view<wchar_t> *)pSVar2);
  fmt::v5::
  visit<testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
            (pSVar2,in_stack_fffffffffffffac8);
  testing::StrictMock<mock_visitor<fmt::v5::basic_string_view<wchar_t>_>_>::~StrictMock(pSVar2);
  return;
}

Assistant:

TEST(ArgTest, WStringArg) {
  wchar_t str_data[] = L"test";
  wchar_t *str = str_data;
  const wchar_t *cstr = str;

  fmt::wstring_view sref(str);
  CHECK_ARG_(wchar_t, cstr, str);
  CHECK_ARG_(wchar_t, cstr, cstr);
  CHECK_ARG_(wchar_t, sref, std::wstring(str));
  CHECK_ARG_(wchar_t, sref, fmt::wstring_view(str));
}